

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadTypeSection(BinaryReader *this,Offset section_size)

{
  char *pcVar1;
  value_type vVar2;
  Index IVar3;
  bool bVar4;
  Result RVar5;
  reference pvVar6;
  Type *local_98;
  Type *local_90;
  Type *result_types;
  Type *param_types;
  uint local_58;
  Type result_type;
  Index j_1;
  Enum local_4c;
  Index num_results;
  uint local_44;
  Type param_type;
  Index j;
  Enum local_38;
  Index num_params;
  uint local_30;
  Type form;
  Index i;
  Enum local_24;
  Offset local_20;
  Offset section_size_local;
  BinaryReader *this_local;
  
  local_20 = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[9])(this->delegate_,section_size);
  bVar4 = Succeeded((Result)local_24);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    i = (Index)ReadCount(this,&this->num_signatures_,"type count");
    bVar4 = Failed((Result)i);
    if (bVar4) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      form = (*this->delegate_->_vptr_BinaryReaderDelegate[10])();
      bVar4 = Succeeded((Result)form);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        for (local_30 = 0; local_30 < this->num_signatures_; local_30 = local_30 + 1) {
          local_38 = (Enum)ReadType(this,(Type *)&num_params,"type form");
          bVar4 = Failed((Result)local_38);
          if (bVar4) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if (num_params != 0xffffffe0) {
            pcVar1 = "\n\n";
            if ((int)num_params < 0) {
              pcVar1 = "  -";
            }
            if ((int)num_params < 1) {
              num_params = -num_params;
            }
            PrintError(this,"unexpected type form (got %s%#x)",pcVar1 + 2,(ulong)num_params);
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          param_type = (Type)ReadCount(this,&j,"function param count");
          bVar4 = Failed((Result)param_type);
          if (bVar4) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize(&this->param_types_,(ulong)j)
          ;
          for (local_44 = 0; local_44 < j; local_44 = local_44 + 1) {
            local_4c = (Enum)ReadType(this,(Type *)&num_results,"function param type");
            bVar4 = Failed((Result)local_4c);
            if (bVar4) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            bVar4 = IsConcreteType(this,num_results);
            IVar3 = num_results;
            if (!bVar4) {
              pcVar1 = "\n\n";
              if ((int)num_results < 0) {
                pcVar1 = "  -";
              }
              if ((int)num_results < 1) {
                num_results = -num_results;
              }
              PrintError(this,"expected valid param type (got %s%#x)",pcVar1 + 2,(ulong)num_results)
              ;
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                               (&this->param_types_,(ulong)local_44);
            *pvVar6 = IVar3;
          }
          result_type = (Type)ReadCount(this,&j_1,"function result count");
          bVar4 = Failed((Result)result_type);
          if (bVar4) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          if ((1 < j_1) &&
             (bVar4 = Features::multi_value_enabled(&this->options_->features), !bVar4)) {
            PrintError(this,"result count must be 0 or 1");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize
                    (&this->result_types_,(ulong)j_1);
          for (local_58 = 0; local_58 < j_1; local_58 = local_58 + 1) {
            param_types._0_4_ =
                 ReadType(this,(Type *)((long)&param_types + 4),"function result type");
            bVar4 = Failed(param_types._0_4_);
            if (bVar4) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            bVar4 = IsConcreteType(this,param_types._4_4_);
            vVar2 = param_types._4_4_;
            if (!bVar4) {
              pcVar1 = "\n\n";
              if (param_types._4_4_ < Any) {
                pcVar1 = "  -";
              }
              if (param_types._4_4_ < ~I64) {
                param_types._4_4_ = -param_types._4_4_;
              }
              PrintError(this,"expected valid result type (got %s%#x)",pcVar1 + 2,
                         (ulong)(uint)param_types._4_4_);
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            pvVar6 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                               (&this->result_types_,(ulong)local_58);
            *pvVar6 = vVar2;
          }
          if (j == 0) {
            local_90 = (Type *)0x0;
          }
          else {
            local_90 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                 (&this->param_types_);
          }
          if (j_1 == 0) {
            local_98 = (Type *)0x0;
          }
          else {
            local_98 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::data
                                 (&this->result_types_);
          }
          RVar5.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xb])
                                  (this->delegate_,(ulong)local_30,(ulong)j,local_90,(ulong)j_1,
                                   local_98);
          bVar4 = Succeeded(RVar5);
          if (((bVar4 ^ 0xffU) & 1) != 0) {
            PrintError(this,"OnType callback failed");
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
        }
        RVar5.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc])();
        bVar4 = Succeeded(RVar5);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          Result::Result((Result *)((long)&this_local + 4),Ok);
        }
        else {
          PrintError(this,"EndTypeSection callback failed");
          Result::Result((Result *)((long)&this_local + 4),Error);
        }
      }
      else {
        PrintError(this,"OnTypeCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginTypeSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTypeSection(Offset section_size) {
  CALLBACK(BeginTypeSection, section_size);
  CHECK_RESULT(ReadCount(&num_signatures_, "type count"));
  CALLBACK(OnTypeCount, num_signatures_);

  for (Index i = 0; i < num_signatures_; ++i) {
    Type form;
    CHECK_RESULT(ReadType(&form, "type form"));
    ERROR_UNLESS(form == Type::Func,
                 "unexpected type form (got " PRItypecode ")",
                 WABT_PRINTF_TYPE_CODE(form));

    Index num_params;
    CHECK_RESULT(ReadCount(&num_params, "function param count"));

    param_types_.resize(num_params);

    for (Index j = 0; j < num_params; ++j) {
      Type param_type;
      CHECK_RESULT(ReadType(&param_type, "function param type"));
      ERROR_UNLESS(IsConcreteType(param_type),
                   "expected valid param type (got " PRItypecode ")",
                   WABT_PRINTF_TYPE_CODE(param_type));
      param_types_[j] = param_type;
    }

    Index num_results;
    CHECK_RESULT(ReadCount(&num_results, "function result count"));
    ERROR_UNLESS(num_results <= 1 || options_.features.multi_value_enabled(),
                 "result count must be 0 or 1");

    result_types_.resize(num_results);

    for (Index j = 0; j < num_results; ++j) {
      Type result_type;
      CHECK_RESULT(ReadType(&result_type, "function result type"));
      ERROR_UNLESS(IsConcreteType(result_type),
                   "expected valid result type (got " PRItypecode ")",
                   WABT_PRINTF_TYPE_CODE(result_type));
      result_types_[j] = result_type;
    }

    Type* param_types = num_params ? param_types_.data() : nullptr;
    Type* result_types = num_results ? result_types_.data() : nullptr;

    CALLBACK(OnType, i, num_params, param_types, num_results, result_types);
  }
  CALLBACK0(EndTypeSection);
  return Result::Ok;
}